

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStruct<Js::AsmJsSlot>
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,AsmJsSlot *value)

{
  anon_union_8_7_4282efbc_for_AsmJsSlot_2 aVar1;
  BufferBuilder *value_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar2;
  
  value_00 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x30,this->alloc,0x35916e);
  value_00->clue = clue;
  value_00->offset = 0xffffffff;
  value_00->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a618;
  aVar1 = value->field_2;
  value_00[1]._vptr_BufferBuilder = *(_func_int ***)value;
  value_00[1].clue = (LPCWSTR)aVar1;
  *(undefined8 *)&value_00[1].offset = *(undefined8 *)&value->isConstVar;
  value_00->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a5f8;
  pIVar2 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend(builder->list,value_00,this->alloc);
  builder->list = pIVar2;
  return 0x18;
}

Assistant:

uint32 PrependStruct(BufferBuilderList & builder, LPCWSTR clue, TStructType * value)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<TStructType>, clue, *value);
        builder.list = builder.list->Prepend(entry, alloc);

        return sizeof(serialization_alignment TStructType);
    }